

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  uint uVar1;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar2;
  mz_uint n;
  mz_bool mVar3;
  undefined4 uVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  mz_uint8 *pmVar9;
  long lVar10;
  mz_uint64 mVar11;
  void *pvVar12;
  ulong uVar13;
  ulong local_b8;
  uint local_ac;
  mz_uint64 local_a8;
  mz_uint8 *local_a0;
  mz_uint64 local_98;
  ulong local_90;
  mz_uint32 local_header_u32 [8];
  mz_uint8 central_header [46];
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  pmVar2 = pSource_zip->m_pState;
  if (pmVar2 == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip->m_total_files <= file_index) {
    return 0;
  }
  if (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING) {
    return 0;
  }
  pvVar12 = (pmVar2->m_central_dir).m_p;
  if (pvVar12 == (void *)0x0) {
    return 0;
  }
  uVar1 = *(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4);
  n = tinyexr::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  local_a8 = pZip->m_archive_size;
  local_90 = (ulong)n;
  local_98 = local_a8 + local_90;
  if (local_98 - 0xffffffb4 < 0xffffffff00000000) {
    return 0;
  }
  pmVar9 = (mz_uint8 *)((long)pvVar12 + (ulong)uVar1);
  uVar1 = *(uint *)(pmVar9 + 0x2a);
  sVar5 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(ulong)uVar1,local_header_u32,0x1e);
  if (sVar5 != 0x1e) {
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
    return 0;
  }
  mVar3 = tinyexr::miniz::mz_zip_writer_write_zeros(pZip,local_a8,n);
  if (mVar3 == 0) {
    return 0;
  }
  sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_98,local_header_u32,0x1e);
  if (sVar5 != 0x1e) {
    return 0;
  }
  uVar8 = (ulong)((uint)(ushort)local_header_u32[7] + (uint)local_header_u32[6]._2_2_ +
                 *(int *)(pmVar9 + 0x14));
  uVar13 = 0x10000;
  if (uVar8 < 0x10000) {
    uVar13 = uVar8;
  }
  sVar5 = 0x10;
  if (0x10 < uVar13) {
    sVar5 = uVar13;
  }
  local_a0 = pmVar9;
  piVar6 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar5);
  if (piVar6 == (int *)0x0) {
    return 0;
  }
  local_b8 = local_a8 + local_90 + 0x1e;
  mVar11 = (ulong)uVar1 + 0x1e;
  for (; uVar8 != 0; uVar8 = uVar8 - sVar5) {
    sVar5 = 0x10000;
    if (uVar8 < 0x10000) {
      sVar5 = uVar8;
    }
    local_a8 = mVar11;
    sVar7 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar11,piVar6,sVar5);
    if ((sVar7 != sVar5) ||
       (sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b8,piVar6,sVar5), sVar7 != sVar5)) {
      pvVar12 = pZip->m_pAlloc_opaque;
      goto LAB_0011ffeb;
    }
    mVar11 = local_a8 + sVar5;
    local_b8 = local_b8 + sVar5;
  }
  if ((local_header_u32[1]._2_1_ & 8) == 0) {
LAB_00120004:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar6);
    if (local_b8 >> 0x20 != 0) {
      return 0;
    }
    sVar5 = (pArray->m_central_dir).m_size;
    central_header._0_8_ = *(undefined8 *)local_a0;
    central_header._8_8_ = *(undefined8 *)(local_a0 + 8);
    central_header._16_8_ = *(undefined8 *)(local_a0 + 0x10);
    central_header._32_6_ = (undefined6)((ulong)*(undefined8 *)(local_a0 + 0x1e) >> 0x10);
    central_header._24_6_ = (undefined6)*(undefined8 *)(local_a0 + 0x18);
    central_header._30_2_ = (undefined2)((ulong)*(undefined8 *)(local_a0 + 0x18) >> 0x30);
    uVar4 = (undefined4)local_98;
    central_header._38_4_ = (undefined4)*(undefined8 *)(local_a0 + 0x26);
    central_header[0x2a] = (char)uVar4;
    central_header[0x2b] = (char)((uint)uVar4 >> 8);
    central_header[0x2c] = (char)((uint)uVar4 >> 0x10);
    central_header[0x2d] = (char)((uint)uVar4 >> 0x18);
    uVar13 = sVar5 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1),
       mVar3 == 0)) {
      return 0;
    }
    (pArray->m_central_dir).m_size = uVar13;
    uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar5 * uVar13 + (long)(pArray->m_central_dir).m_p),central_header,uVar13 * 0x2e
          );
    lVar10 = (ulong)*(ushort *)(local_a0 + 0x20) +
             (ulong)*(ushort *)(local_a0 + 0x1e) + (ulong)*(ushort *)(local_a0 + 0x1c);
    sVar7 = (pArray->m_central_dir).m_size;
    uVar13 = sVar7 + lVar10;
    if ((uVar13 <= (pArray->m_central_dir).m_capacity) ||
       (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1),
       mVar3 != 0)) {
      (pArray->m_central_dir).m_size = uVar13;
      uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar7 * uVar13 + (long)(pArray->m_central_dir).m_p),local_a0 + 0x2e,
             lVar10 * uVar13);
      if (*(int *)((long)&(pArray->m_central_dir).m_size + 4) != 0) {
        return 0;
      }
      local_ac = (uint)sVar5;
      sVar7 = (pArray->m_central_dir_offsets).m_size;
      uVar13 = sVar7 + 1;
      if ((uVar13 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity
                            (pZip,&pArray->m_central_dir_offsets,uVar13,1), mVar3 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar13;
        uVar13 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar7 * uVar13 + (long)(pArray->m_central_dir_offsets).m_p),&local_ac,uVar13
              );
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_b8;
        return 1;
      }
    }
    if (((pArray->m_central_dir).m_capacity < sVar5) &&
       (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,sVar5,0),
       mVar3 == 0)) {
      return 0;
    }
    (pArray->m_central_dir).m_size = sVar5;
    return 0;
  }
  sVar5 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar11,piVar6,0x10);
  if (sVar5 == 0x10) {
    local_ac = (uint)(*piVar6 == 0x8074b50) * 4 + 0xc;
    uVar13 = (ulong)local_ac;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b8,piVar6,uVar13);
    if (sVar5 == uVar13) {
      local_b8 = local_b8 + uVar13;
      goto LAB_00120004;
    }
    pvVar12 = pZip->m_pAlloc_opaque;
  }
  else {
    pvVar12 = pZip->m_pAlloc_opaque;
  }
LAB_0011ffeb:
  (*pZip->m_pFree)(pvVar12,piVar6);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL == (pBuf = pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1,
                   (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                  MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE,
                                         comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF) return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF) return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}